

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *
deqp::gles31::bb::anon_unknown_11::blockLocationsToPtrs
          (vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
           *__return_storage_ptr__,BufferLayout *layout,
          vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
          *blockLocations,vector<void_*,_std::allocator<void_*>_> *bufPtrs)

{
  pointer pBVar1;
  pointer pBVar2;
  long lVar3;
  long lVar4;
  pointer pBVar5;
  long lVar6;
  long lVar7;
  BlockDataPtr BVar8;
  allocator_type local_41;
  vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
  *local_40;
  vector<void_*,_std::allocator<void_*>_> *local_38;
  
  local_40 = blockLocations;
  local_38 = bufPtrs;
  std::vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>::
  vector(__return_storage_ptr__,
         ((long)(blockLocations->
                super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(blockLocations->
                super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,&local_41);
  pBVar5 = (layout->blocks).
           super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(layout->blocks).
                              super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) >> 6)) {
    lVar6 = 2;
    lVar4 = 0;
    lVar3 = 2;
    lVar7 = 0;
    do {
      pBVar1 = (local_40->
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
               )._M_impl.super__Vector_impl_data._M_start;
      BVar8 = getBlockDataPtr(layout,(BlockLayoutEntry *)((long)&(pBVar5->name)._M_dataplus + lVar4)
                              ,(void *)((long)*(int *)((long)pBVar1 + lVar3 * 4 + -4) +
                                       (long)(local_38->
                                             super__Vector_base<void_*,_std::allocator<void_*>_>).
                                             _M_impl.super__Vector_impl_data._M_start
                                             [*(int *)((long)pBVar1 + lVar3 * 4 + -8)]),
                              (&pBVar1->index)[lVar3]);
      pBVar2 = (__return_storage_ptr__->
               super__Vector_base<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(void **)((long)pBVar2 + lVar6 * 4 + -8) = BVar8.ptr;
      *(long *)((long)&pBVar2->ptr + lVar6 * 4) = BVar8._8_8_;
      lVar7 = lVar7 + 1;
      pBVar5 = (layout->blocks).
               super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x40;
      lVar3 = lVar3 + 3;
      lVar6 = lVar6 + 4;
    } while (lVar7 < (int)((ulong)((long)(layout->blocks).
                                         super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5)
                          >> 6));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BlockDataPtr> blockLocationsToPtrs (const BufferLayout& layout, const vector<BlockLocation>& blockLocations, const vector<void*>& bufPtrs)
{
	vector<BlockDataPtr> blockPtrs(blockLocations.size());

	DE_ASSERT(layout.blocks.size() == blockLocations.size());

	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
		const BlockLocation&	location		= blockLocations[blockNdx];

		blockPtrs[blockNdx] = getBlockDataPtr(layout, blockLayout, (deUint8*)bufPtrs[location.index] + location.offset, location.size);
	}

	return blockPtrs;
}